

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msg32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  bool bVar68;
  bool bVar69;
  uint uVar70;
  int iVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  uint uVar78;
  code *pcVar79;
  uint uVar80;
  uint uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  uint uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  secp256k1_scalar s;
  secp256k1_scalar r;
  uint64_t l [8];
  int overflow;
  uchar b [32];
  secp256k1_scalar local_288;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  secp256k1_context *local_240;
  uint local_238;
  int local_234;
  secp256k1_ecdsa_signature *local_230;
  uchar *local_228;
  uchar *local_220;
  void *local_218;
  secp256k1_nonce_function local_210;
  secp256k1_scalar local_208;
  uchar local_1e8 [32];
  secp256k1_scalar local_1c8;
  secp256k1_scalar local_1a8;
  uint64_t local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  undefined1 local_158 [16];
  secp256k1_gej local_148;
  uchar local_c8 [32];
  secp256k1_scalar local_a8;
  secp256k1_ge local_88;
  
  local_240 = ctx;
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_ecdsa_sign_cold_1();
    uVar78 = 0;
  }
  else {
    local_268 = (undefined1  [16])0x0;
    local_258 = (undefined1  [16])0x0;
    local_288.d[0] = 0;
    local_288.d[1] = 0;
    local_288.d[2] = 0;
    local_288.d[3] = 0;
    pcVar79 = nonce_function_rfc6979;
    if (noncefp != (secp256k1_nonce_function)0x0) {
      pcVar79 = noncefp;
    }
    secp256k1_scalar_set_b32(&local_1a8,seckey,(int *)&local_148);
    uVar70 = (uint)(((local_1a8.d[2] != 0 || local_1a8.d[3] != 0) ||
                    (local_1a8.d[1] != 0 || local_1a8.d[0] != 0)) && (int)local_148.x.n[0] == 0);
    uVar82 = (ulong)(uVar70 ^ 1);
    uVar72 = uVar82 - 1;
    local_1a8.d[0] = local_1a8.d[0] & uVar72 | uVar82;
    local_1a8.d[1] = local_1a8.d[1] & uVar72;
    local_1a8.d[2] = local_1a8.d[2] & uVar72;
    local_1a8.d[3] = uVar72 & local_1a8.d[3];
    secp256k1_scalar_set_b32(&local_1c8,msg32,(int *)0x0);
    local_210 = pcVar79;
    iVar71 = (*pcVar79)(local_1e8,msg32,seckey,(uchar *)0x0,noncedata,0);
    uVar78 = 0;
    uVar73 = 0;
    uVar74 = 0;
    uVar72 = 0;
    uVar82 = 0;
    uVar88 = 0;
    uVar89 = 0;
    uVar75 = 0;
    uVar76 = 0;
    if (iVar71 != 0) {
      local_240 = (secp256k1_context *)&local_240->ecmult_gen_ctx;
      uVar78 = 1;
      local_230 = signature;
      local_228 = msg32;
      local_220 = seckey;
      local_218 = noncedata;
      do {
        secp256k1_scalar_set_b32(&local_208,local_1e8,(int *)&local_148);
        if (((int)local_148.x.n[0] == 0) &&
           ((local_208.d[3] != 0 || local_208.d[1] != 0) ||
            (local_208.d[2] != 0 || local_208.d[0] != 0))) {
          local_234 = 0;
          secp256k1_ecmult_gen((secp256k1_ecmult_gen_context *)local_240,&local_148,&local_208);
          secp256k1_ge_set_gej(&local_88,&local_148);
          secp256k1_fe_normalize(&local_88.x);
          secp256k1_fe_normalize(&local_88.y);
          secp256k1_fe_get_b32(local_c8,&local_88.x);
          secp256k1_scalar_set_b32((secp256k1_scalar *)local_268,local_c8,&local_234);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_268._0_8_;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = local_1a8.d[0];
          uVar73 = SUB168(auVar1 * auVar33,8);
          auVar66._8_8_ = 0;
          auVar66._0_8_ = uVar73;
          local_188 = SUB168(auVar1 * auVar33,0);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_268._0_8_;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = local_1a8.d[1];
          auVar2 = auVar2 * auVar34;
          uVar82 = SUB168(auVar2 + auVar66,0);
          uVar88 = SUB168(auVar2 + auVar66,8);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_268._8_8_;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = local_1a8.d[0];
          uVar74 = SUB168(auVar3 * auVar35,8);
          uVar72 = SUB168(auVar3 * auVar35,0);
          local_180 = uVar82 + uVar72;
          uVar72 = (ulong)CARRY8(uVar82,uVar72);
          uVar82 = uVar88 + uVar74;
          uVar89 = uVar82 + uVar72;
          uVar90 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar73,auVar2._0_8_)) +
                   (ulong)(CARRY8(uVar88,uVar74) || CARRY8(uVar82,uVar72));
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_268._0_8_;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_1a8.d[2];
          uVar75 = SUB168(auVar4 * auVar36,8);
          uVar72 = SUB168(auVar4 * auVar36,0);
          uVar73 = uVar89 + uVar72;
          uVar72 = (ulong)CARRY8(uVar89,uVar72);
          uVar74 = uVar90 + uVar75;
          uVar91 = uVar74 + uVar72;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_268._8_8_;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = local_1a8.d[1];
          uVar76 = SUB168(auVar5 * auVar37,8);
          uVar82 = SUB168(auVar5 * auVar37,0);
          uVar89 = uVar73 + uVar82;
          uVar82 = (ulong)CARRY8(uVar73,uVar82);
          uVar88 = uVar91 + uVar76;
          uVar92 = uVar88 + uVar82;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_258._0_8_;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = local_1a8.d[0];
          uVar77 = SUB168(auVar6 * auVar38,8);
          uVar73 = SUB168(auVar6 * auVar38,0);
          local_178 = uVar89 + uVar73;
          uVar73 = (ulong)CARRY8(uVar89,uVar73);
          uVar89 = uVar92 + uVar77;
          uVar93 = uVar89 + uVar73;
          uVar83 = (ulong)(CARRY8(uVar90,uVar75) || CARRY8(uVar74,uVar72)) +
                   (ulong)(CARRY8(uVar91,uVar76) || CARRY8(uVar88,uVar82)) +
                   (ulong)(CARRY8(uVar92,uVar77) || CARRY8(uVar89,uVar73));
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_268._0_8_;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = local_1a8.d[3];
          uVar77 = SUB168(auVar7 * auVar39,8);
          uVar72 = SUB168(auVar7 * auVar39,0);
          uVar73 = uVar93 + uVar72;
          uVar72 = (ulong)CARRY8(uVar93,uVar72);
          uVar88 = uVar83 + uVar77;
          uVar93 = uVar88 + uVar72;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_268._8_8_;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = local_1a8.d[2];
          uVar90 = SUB168(auVar8 * auVar40,8);
          uVar82 = SUB168(auVar8 * auVar40,0);
          uVar74 = uVar73 + uVar82;
          uVar82 = (ulong)CARRY8(uVar73,uVar82);
          uVar89 = uVar93 + uVar90;
          uVar84 = uVar89 + uVar82;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = local_258._0_8_;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = local_1a8.d[1];
          uVar91 = SUB168(auVar9 * auVar41,8);
          uVar73 = SUB168(auVar9 * auVar41,0);
          uVar76 = uVar74 + uVar73;
          uVar73 = (ulong)CARRY8(uVar74,uVar73);
          uVar75 = uVar84 + uVar91;
          uVar85 = uVar75 + uVar73;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_258._8_8_;
          auVar42._8_8_ = 0;
          auVar42._0_8_ = local_1a8.d[0];
          uVar92 = SUB168(auVar10 * auVar42,8);
          uVar74 = SUB168(auVar10 * auVar42,0);
          local_170 = uVar76 + uVar74;
          uVar74 = (ulong)CARRY8(uVar76,uVar74);
          uVar76 = uVar85 + uVar92;
          uVar86 = uVar76 + uVar74;
          uVar90 = (ulong)(CARRY8(uVar83,uVar77) || CARRY8(uVar88,uVar72)) +
                   (ulong)(CARRY8(uVar93,uVar90) || CARRY8(uVar89,uVar82)) +
                   (ulong)(CARRY8(uVar84,uVar91) || CARRY8(uVar75,uVar73)) +
                   (ulong)(CARRY8(uVar85,uVar92) || CARRY8(uVar76,uVar74));
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_268._8_8_;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = local_1a8.d[3];
          uVar75 = SUB168(auVar11 * auVar43,8);
          uVar72 = SUB168(auVar11 * auVar43,0);
          uVar73 = uVar86 + uVar72;
          uVar72 = (ulong)CARRY8(uVar86,uVar72);
          uVar74 = uVar90 + uVar75;
          uVar91 = uVar74 + uVar72;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_258._0_8_;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = local_1a8.d[2];
          uVar76 = SUB168(auVar12 * auVar44,8);
          uVar82 = SUB168(auVar12 * auVar44,0);
          uVar89 = uVar73 + uVar82;
          uVar82 = (ulong)CARRY8(uVar73,uVar82);
          uVar88 = uVar91 + uVar76;
          uVar92 = uVar88 + uVar82;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_258._8_8_;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = local_1a8.d[1];
          uVar77 = SUB168(auVar13 * auVar45,8);
          uVar73 = SUB168(auVar13 * auVar45,0);
          local_168 = uVar89 + uVar73;
          uVar73 = (ulong)CARRY8(uVar89,uVar73);
          uVar89 = uVar92 + uVar77;
          uVar83 = uVar89 + uVar73;
          uVar75 = (ulong)(CARRY8(uVar90,uVar75) || CARRY8(uVar74,uVar72)) +
                   (ulong)(CARRY8(uVar91,uVar76) || CARRY8(uVar88,uVar82)) +
                   (ulong)(CARRY8(uVar92,uVar77) || CARRY8(uVar89,uVar73));
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_258._0_8_;
          auVar46._8_8_ = 0;
          auVar46._0_8_ = local_1a8.d[3];
          uVar88 = SUB168(auVar14 * auVar46,8);
          uVar72 = SUB168(auVar14 * auVar46,0);
          uVar74 = uVar83 + uVar72;
          uVar72 = (ulong)CARRY8(uVar83,uVar72);
          uVar73 = uVar75 + uVar88;
          uVar76 = uVar73 + uVar72;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = local_258._8_8_;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = local_1a8.d[2];
          uVar89 = SUB168(auVar15 * auVar47,8);
          uVar82 = SUB168(auVar15 * auVar47,0);
          local_160 = uVar74 + uVar82;
          uVar82 = (ulong)CARRY8(uVar74,uVar82);
          uVar74 = uVar76 + uVar89;
          local_158._8_8_ =
               (ulong)(CARRY8(uVar75,uVar88) || CARRY8(uVar73,uVar72)) +
               (ulong)(CARRY8(uVar76,uVar89) || CARRY8(uVar74,uVar82));
          local_158._0_8_ = uVar74 + uVar82;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_258._8_8_;
          auVar48._8_8_ = 0;
          auVar48._0_8_ = local_1a8.d[3];
          local_158 = auVar16 * auVar48 + local_158;
          secp256k1_scalar_reduce_512(&local_a8,&local_188);
          secp256k1_scalar_add(&local_a8,&local_a8,&local_1c8);
          local_238 = uVar78;
          secp256k1_scalar_inverse(&local_288,&local_208);
          noncedata = local_218;
          seckey = local_220;
          msg32 = local_228;
          uVar78 = local_238;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_288.d[0];
          auVar49._8_8_ = 0;
          auVar49._0_8_ = local_a8.d[0];
          uVar73 = SUB168(auVar17 * auVar49,8);
          auVar67._8_8_ = 0;
          auVar67._0_8_ = uVar73;
          local_188 = SUB168(auVar17 * auVar49,0);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_288.d[0];
          auVar50._8_8_ = 0;
          auVar50._0_8_ = local_a8.d[1];
          auVar18 = auVar18 * auVar50;
          uVar82 = SUB168(auVar18 + auVar67,0);
          uVar88 = SUB168(auVar18 + auVar67,8);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_288.d[1];
          auVar51._8_8_ = 0;
          auVar51._0_8_ = local_a8.d[0];
          uVar74 = SUB168(auVar19 * auVar51,8);
          uVar72 = SUB168(auVar19 * auVar51,0);
          local_180 = uVar82 + uVar72;
          uVar72 = (ulong)CARRY8(uVar82,uVar72);
          uVar82 = uVar88 + uVar74;
          uVar89 = uVar82 + uVar72;
          uVar90 = (ulong)CARRY8(auVar18._8_8_,(ulong)CARRY8(uVar73,auVar18._0_8_)) +
                   (ulong)(CARRY8(uVar88,uVar74) || CARRY8(uVar82,uVar72));
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_288.d[0];
          auVar52._8_8_ = 0;
          auVar52._0_8_ = local_a8.d[2];
          uVar75 = SUB168(auVar20 * auVar52,8);
          uVar72 = SUB168(auVar20 * auVar52,0);
          uVar73 = uVar89 + uVar72;
          uVar72 = (ulong)CARRY8(uVar89,uVar72);
          uVar74 = uVar90 + uVar75;
          uVar91 = uVar74 + uVar72;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = local_288.d[1];
          auVar53._8_8_ = 0;
          auVar53._0_8_ = local_a8.d[1];
          uVar76 = SUB168(auVar21 * auVar53,8);
          uVar82 = SUB168(auVar21 * auVar53,0);
          uVar89 = uVar73 + uVar82;
          uVar82 = (ulong)CARRY8(uVar73,uVar82);
          uVar88 = uVar91 + uVar76;
          uVar92 = uVar88 + uVar82;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = local_288.d[2];
          auVar54._8_8_ = 0;
          auVar54._0_8_ = local_a8.d[0];
          uVar77 = SUB168(auVar22 * auVar54,8);
          uVar73 = SUB168(auVar22 * auVar54,0);
          local_178 = uVar89 + uVar73;
          uVar73 = (ulong)CARRY8(uVar89,uVar73);
          uVar89 = uVar92 + uVar77;
          uVar93 = uVar89 + uVar73;
          uVar83 = (ulong)(CARRY8(uVar90,uVar75) || CARRY8(uVar74,uVar72)) +
                   (ulong)(CARRY8(uVar91,uVar76) || CARRY8(uVar88,uVar82)) +
                   (ulong)(CARRY8(uVar92,uVar77) || CARRY8(uVar89,uVar73));
          auVar23._8_8_ = 0;
          auVar23._0_8_ = local_288.d[0];
          auVar55._8_8_ = 0;
          auVar55._0_8_ = local_a8.d[3];
          uVar77 = SUB168(auVar23 * auVar55,8);
          uVar72 = SUB168(auVar23 * auVar55,0);
          uVar73 = uVar93 + uVar72;
          uVar72 = (ulong)CARRY8(uVar93,uVar72);
          uVar88 = uVar83 + uVar77;
          uVar93 = uVar88 + uVar72;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = local_288.d[1];
          auVar56._8_8_ = 0;
          auVar56._0_8_ = local_a8.d[2];
          uVar90 = SUB168(auVar24 * auVar56,8);
          uVar82 = SUB168(auVar24 * auVar56,0);
          uVar74 = uVar73 + uVar82;
          uVar82 = (ulong)CARRY8(uVar73,uVar82);
          uVar89 = uVar93 + uVar90;
          uVar84 = uVar89 + uVar82;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_288.d[2];
          auVar57._8_8_ = 0;
          auVar57._0_8_ = local_a8.d[1];
          uVar91 = SUB168(auVar25 * auVar57,8);
          uVar73 = SUB168(auVar25 * auVar57,0);
          uVar76 = uVar74 + uVar73;
          uVar73 = (ulong)CARRY8(uVar74,uVar73);
          uVar75 = uVar84 + uVar91;
          uVar85 = uVar75 + uVar73;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = local_288.d[3];
          auVar58._8_8_ = 0;
          auVar58._0_8_ = local_a8.d[0];
          uVar92 = SUB168(auVar26 * auVar58,8);
          uVar74 = SUB168(auVar26 * auVar58,0);
          local_170 = uVar76 + uVar74;
          uVar74 = (ulong)CARRY8(uVar76,uVar74);
          uVar76 = uVar85 + uVar92;
          uVar86 = uVar76 + uVar74;
          uVar90 = (ulong)(CARRY8(uVar83,uVar77) || CARRY8(uVar88,uVar72)) +
                   (ulong)(CARRY8(uVar93,uVar90) || CARRY8(uVar89,uVar82)) +
                   (ulong)(CARRY8(uVar84,uVar91) || CARRY8(uVar75,uVar73)) +
                   (ulong)(CARRY8(uVar85,uVar92) || CARRY8(uVar76,uVar74));
          auVar27._8_8_ = 0;
          auVar27._0_8_ = local_288.d[1];
          auVar59._8_8_ = 0;
          auVar59._0_8_ = local_a8.d[3];
          uVar75 = SUB168(auVar27 * auVar59,8);
          uVar72 = SUB168(auVar27 * auVar59,0);
          uVar73 = uVar86 + uVar72;
          uVar72 = (ulong)CARRY8(uVar86,uVar72);
          uVar74 = uVar90 + uVar75;
          uVar91 = uVar74 + uVar72;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = local_288.d[2];
          auVar60._8_8_ = 0;
          auVar60._0_8_ = local_a8.d[2];
          uVar76 = SUB168(auVar28 * auVar60,8);
          uVar82 = SUB168(auVar28 * auVar60,0);
          uVar89 = uVar73 + uVar82;
          uVar82 = (ulong)CARRY8(uVar73,uVar82);
          uVar88 = uVar91 + uVar76;
          uVar92 = uVar88 + uVar82;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_288.d[3];
          auVar61._8_8_ = 0;
          auVar61._0_8_ = local_a8.d[1];
          uVar77 = SUB168(auVar29 * auVar61,8);
          uVar73 = SUB168(auVar29 * auVar61,0);
          local_168 = uVar89 + uVar73;
          uVar73 = (ulong)CARRY8(uVar89,uVar73);
          uVar89 = uVar92 + uVar77;
          uVar83 = uVar89 + uVar73;
          uVar75 = (ulong)(CARRY8(uVar90,uVar75) || CARRY8(uVar74,uVar72)) +
                   (ulong)(CARRY8(uVar91,uVar76) || CARRY8(uVar88,uVar82)) +
                   (ulong)(CARRY8(uVar92,uVar77) || CARRY8(uVar89,uVar73));
          auVar30._8_8_ = 0;
          auVar30._0_8_ = local_288.d[2];
          auVar62._8_8_ = 0;
          auVar62._0_8_ = local_a8.d[3];
          uVar88 = SUB168(auVar30 * auVar62,8);
          uVar72 = SUB168(auVar30 * auVar62,0);
          uVar74 = uVar83 + uVar72;
          uVar72 = (ulong)CARRY8(uVar83,uVar72);
          uVar73 = uVar75 + uVar88;
          uVar76 = uVar73 + uVar72;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = local_288.d[3];
          auVar63._8_8_ = 0;
          auVar63._0_8_ = local_a8.d[2];
          uVar89 = SUB168(auVar31 * auVar63,8);
          uVar82 = SUB168(auVar31 * auVar63,0);
          local_160 = uVar74 + uVar82;
          uVar82 = (ulong)CARRY8(uVar74,uVar82);
          uVar74 = uVar76 + uVar89;
          auVar65._8_8_ =
               (ulong)(CARRY8(uVar75,uVar88) || CARRY8(uVar73,uVar72)) +
               (ulong)(CARRY8(uVar76,uVar89) || CARRY8(uVar74,uVar82));
          auVar65._0_8_ = uVar74 + uVar82;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = local_288.d[3];
          auVar64._8_8_ = 0;
          auVar64._0_8_ = local_a8.d[3];
          local_158 = auVar32 * auVar64 + auVar65;
          secp256k1_scalar_reduce_512(&local_288,&local_188);
          uVar80 = -(int)((long)local_288.d[3] >> 0x3f);
          uVar81 = uVar80 ^ 1;
          uVar87 = uVar81;
          if (local_288.d[2] == 0xffffffffffffffff) {
            uVar87 = 0;
          }
          if (0x5d576e7357a4501c < local_288.d[1]) {
            uVar81 = 0;
          }
          uVar81 = (uVar81 | uVar87 | local_288.d[3] < 0x7fffffffffffffff) ^ 1;
          uVar87 = 0;
          if (0xdfe92f46681b20a0 < local_288.d[0]) {
            uVar87 = uVar81;
          }
          if (0x5d576e7357a4501d < local_288.d[1]) {
            uVar87 = uVar81;
          }
          bVar68 = uVar87 != 0;
          bVar69 = uVar80 != 0;
          uVar72 = 0;
          if (bVar68 || bVar69) {
            uVar72 = 0xbfd25e8cd0364142;
          }
          uVar73 = 0;
          if (bVar68 || bVar69) {
            uVar73 = 0xbaaedce6af48a03b;
          }
          uVar74 = 0;
          if (bVar68 || bVar69) {
            uVar74 = 0xfffffffffffffffe;
          }
          uVar75 = -(ulong)(bVar68 || bVar69);
          uVar82 = (local_288.d[0] ^ uVar75) + uVar72;
          uVar88 = (ulong)CARRY8(local_288.d[0] ^ uVar75,uVar72);
          uVar89 = (local_288.d[1] ^ uVar75) + uVar73;
          uVar72 = uVar89 + uVar88;
          uVar88 = (ulong)(CARRY8(local_288.d[1] ^ uVar75,uVar73) || CARRY8(uVar89,uVar88));
          uVar89 = (local_288.d[2] ^ uVar75) + uVar74;
          uVar73 = uVar89 + uVar88;
          uVar74 = ((uVar75 ^ local_288.d[3]) - (ulong)(bVar68 || bVar69)) +
                   (ulong)(CARRY8(local_288.d[2] ^ uVar75,uVar74) || CARRY8(uVar89,uVar88));
          if (((local_288.d[2] == 0 && local_288.d[3] == 0) && local_288.d[1] == 0) &&
              local_288.d[0] == 0) {
            uVar82 = 0;
            uVar72 = 0;
            uVar73 = 0;
            uVar74 = 0;
          }
          local_288.d[0] = uVar82;
          local_288.d[1] = uVar72;
          local_288.d[2] = uVar73;
          local_288.d[3] = uVar74;
          if (((uVar72 != 0 || uVar82 != 0) || uVar73 != 0) || uVar74 != 0) {
            if ((local_258._0_8_ != 0 || local_258._8_8_ != 0) ||
                (local_268._8_8_ != 0 || local_268._0_8_ != 0)) {
              uVar78 = 1;
              uVar88 = local_258._8_8_;
              uVar89 = local_258._0_8_;
              uVar75 = local_268._8_8_;
              uVar76 = local_268._0_8_;
              signature = local_230;
              goto LAB_0010d492;
            }
          }
        }
        iVar71 = (*local_210)(local_1e8,msg32,seckey,(uchar *)0x0,noncedata,uVar78);
        uVar78 = uVar78 + 1;
      } while (iVar71 != 0);
      uVar78 = 0;
      uVar73 = local_288.d[2];
      uVar74 = local_288.d[3];
      uVar72 = local_288.d[1];
      uVar82 = local_288.d[0];
      uVar88 = local_258._8_8_;
      uVar89 = local_258._0_8_;
      uVar75 = local_268._8_8_;
      uVar76 = local_268._0_8_;
      signature = local_230;
    }
LAB_0010d492:
    uVar78 = uVar78 & uVar70;
    uVar77 = (ulong)(uVar78 ^ 1) - 1;
    *(ulong *)(signature->data + 0x10) = uVar89 & uVar77;
    *(ulong *)(signature->data + 0x18) = uVar88 & uVar77;
    *(ulong *)signature->data = uVar76 & uVar77;
    *(ulong *)(signature->data + 8) = uVar75 & uVar77;
    *(ulong *)(signature->data + 0x20) = uVar82 & uVar77;
    *(ulong *)(signature->data + 0x28) = uVar72 & uVar77;
    *(ulong *)(signature->data + 0x30) = uVar73 & uVar77;
    *(ulong *)(signature->data + 0x38) = uVar77 & uVar74;
  }
  return uVar78;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, msg32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}